

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_diag_sse2_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  uint uVar23;
  uint uVar24;
  unkbyte10 Var25;
  undefined1 auVar26 [16];
  longlong lVar27;
  ulong uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  short sVar43;
  short sVar44;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *piVar45;
  undefined8 extraout_RDX;
  int *array;
  undefined4 in_register_00000084;
  ulong uVar47;
  undefined4 in_register_0000008c;
  ushort uVar48;
  ushort uVar49;
  ushort uVar52;
  ushort uVar53;
  uint uVar50;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  ushort uVar54;
  ushort uVar58;
  ushort uVar59;
  ushort uVar61;
  ushort uVar62;
  uint uVar60;
  ushort uVar63;
  undefined1 auVar51 [16];
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  undefined8 extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i alVar69;
  __m128i alVar70;
  int32_t s2Len_00;
  uint local_a40;
  uint local_a3c;
  int local_a28;
  int local_a24;
  int local_a10;
  int local_a0c;
  int local_9f8;
  int local_9f4;
  int local_9e0;
  int local_9dc;
  int local_9c8;
  int local_9c4;
  int local_9b0;
  int local_9ac;
  int local_998;
  int local_994;
  int local_968;
  int local_964;
  longlong *plStack_960;
  int32_t k;
  int16_t *j_1;
  int16_t *i_1;
  int16_t *t;
  __m128i cond_Jlt;
  __m128i cond_all;
  __m128i cond_max;
  __m128i cond_eq;
  __m128i cond_valid_IJ;
  __m128i cond_valid_J;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIltLimit;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vJLimit;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vN;
  __m128i vOne;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf0;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_6de;
  int iStack_6d8;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_368;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_360;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  uint uStack_204;
  uint uStack_1fc;
  uint uStack_1f4;
  uint uStack_1ec;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  ulong uVar46;
  int16_t *piVar71;
  
  mask[1] = CONCAT44(in_register_0000008c,gap);
  uVar47 = CONCAT44(in_register_00000084,open);
  s2B = (int16_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_sse2_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_diag_sse2_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_diag_sse2_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_diag_sse2_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_sse2_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_sse2_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_diag_sse2_128_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_968 = _s1Len;
    if (matrix->type != 0) {
      local_968 = matrix->length;
    }
    _POS_LIMIT = 0;
    iStack_6d8 = 0;
    N._0_2_ = (short)open;
    sVar43 = (short)N;
    if (matrix->min <= -open) {
      sVar43 = -(short)matrix->min;
    }
    sVar43 = sVar43 + -0x7fff;
    sVar44 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    vSaturationCheckMax[0] = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    vSaturationCheckMax[1] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    vSaturationCheckMin[0] = CONCAT26(sVar44,CONCAT24(sVar44,CONCAT22(sVar44,sVar44)));
    lVar27 = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    uVar28 = CONCAT26(sVar43,CONCAT24(sVar43,CONCAT22(sVar43,sVar43)));
    auVar26._8_8_ = uVar28;
    auVar26._0_8_ = lVar27;
    uVar29 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar30 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (undefined2)gap;
    uVar31 = CONCAT26((undefined2)PAD,
                      CONCAT24((undefined2)PAD,CONCAT22((undefined2)PAD,(undefined2)PAD)));
    uVar32 = CONCAT26((undefined2)PAD,
                      CONCAT24((undefined2)PAD,CONCAT22((undefined2)PAD,(undefined2)PAD)));
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    s2Len_PAD._0_2_ = (undefined2)local_968;
    vILimit[0] = CONCAT26((undefined2)s2Len_PAD,
                          CONCAT24((undefined2)s2Len_PAD,
                                   CONCAT22((undefined2)s2Len_PAD,(undefined2)s2Len_PAD)));
    vILimit[1] = lVar27;
    vEndJ[0] = uVar28;
    vEndJ[1] = lVar27;
    vEndI[0] = uVar28;
    vEndI[1] = lVar27;
    _s1_local = (char *)parasail_result_new_table1(local_968,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8201004;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      alVar69[0] = (size_t)(s2Len + 0xe);
      array = (int *)0x0;
      ptr_01 = parasail_memalign_int16_t(0x10,alVar69[0]);
      piVar45 = ptr + 7;
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          alVar69[0] = (size_t)(local_968 + 7);
          array = (int *)0x0;
          s2B = parasail_memalign_int16_t(0x10,alVar69[0]);
          if (s2B == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_968; end_query = end_query + 1) {
            s2B[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_968; end_query < local_968 + 7; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar45[end_ref] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          piVar45[end_ref] = 0;
        }
        while (end_ref = iVar7, end_ref < s2Len + 7) {
          piVar45[end_ref] = 0;
          iVar7 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = 0;
          ptr_01[(long)end_ref + 7] = sVar43;
        }
        for (end_ref = -7; iVar7 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 7] = sVar43;
          ptr_01[(long)end_ref + 7] = sVar43;
        }
        while (end_ref = iVar7, end_ref < s2Len + 7) {
          ptr_00[(long)end_ref + 7] = sVar43;
          ptr_01[(long)end_ref + 7] = sVar43;
          iVar7 = end_ref + 1;
        }
        for (end_query = 0; end_query < local_968; end_query = end_query + 8) {
          vOpen[1] = auVar26._2_8_;
          vNegInf0[0] = uVar28 >> 0x10;
          vNH[0] = vNegInf0[0];
          vWH[1] = vOpen[1];
          vWH[0]._6_2_ = 0;
          vF[0] = uVar28;
          vJ[1] = lVar27;
          vJ[0]._0_6_ = 0xfffffffefffd;
          matrow0 = (int *)0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          piVar15 = matrix->matrix;
          iVar7 = matrix->size;
          if (matrix->type == 0) {
            local_994 = (int)s2B[end_query];
          }
          else {
            if (end_query < local_968) {
              local_998 = end_query;
            }
            else {
              local_998 = local_968 + -1;
            }
            local_994 = local_998;
          }
          piVar16 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_9ac = (int)s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_968) {
              local_9b0 = end_query + 1;
            }
            else {
              local_9b0 = local_968 + -1;
            }
            local_9ac = local_9b0;
          }
          piVar17 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_9c4 = (int)s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_968) {
              local_9c8 = end_query + 2;
            }
            else {
              local_9c8 = local_968 + -1;
            }
            local_9c4 = local_9c8;
          }
          piVar18 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_9dc = (int)s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_968) {
              local_9e0 = end_query + 3;
            }
            else {
              local_9e0 = local_968 + -1;
            }
            local_9dc = local_9e0;
          }
          piVar19 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_9f4 = (int)s2B[end_query + 4];
          }
          else {
            if (end_query + 4 < local_968) {
              local_9f8 = end_query + 4;
            }
            else {
              local_9f8 = local_968 + -1;
            }
            local_9f4 = local_9f8;
          }
          piVar20 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_a0c = (int)s2B[end_query + 5];
          }
          else {
            if (end_query + 5 < local_968) {
              local_a10 = end_query + 5;
            }
            else {
              local_a10 = local_968 + -1;
            }
            local_a0c = local_a10;
          }
          piVar21 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_a24 = (int)s2B[end_query + 6];
          }
          else {
            if (end_query + 6 < local_968) {
              local_a28 = end_query + 6;
            }
            else {
              local_a28 = local_968 + -1;
            }
            local_a24 = local_a28;
          }
          piVar22 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_a3c = (uint)s2B[end_query + 7];
          }
          else {
            if (end_query + 7 < local_968) {
              local_a40 = end_query + 7;
            }
            else {
              local_a40 = local_968 - 1;
            }
            local_a3c = local_a40;
          }
          uVar46 = (ulong)local_a3c;
          vF[1] = lVar27;
          vE[0] = uVar28;
          vE[1]._0_2_ = sVar43;
          vE[1]._2_2_ = sVar43;
          vE[1]._4_2_ = sVar43;
          vE[1]._6_2_ = sVar43;
          vWH[0]._0_2_ = sVar43;
          vWH[0]._2_2_ = sVar43;
          vWH[0]._4_2_ = sVar43;
          for (end_ref = 0; auVar40 = stack0xfffffffffffff7d8, auVar51 = stack0xfffffffffffff7a8,
              end_ref < s2Len + 7; end_ref = end_ref + 1) {
            Var25 = CONCAT28((short)vWH[0],
                             CONCAT26(vE[1]._6_2_,
                                      CONCAT24(vE[1]._4_2_,CONCAT22(vE[1]._2_2_,(short)vE[1]))));
            auVar68._10_2_ = vWH[0]._2_2_;
            auVar68._0_10_ = Var25;
            auVar68._12_2_ = vWH[0]._4_2_;
            auVar68._14_2_ = vWH[0]._6_2_;
            stack0xfffffffffffff7d8 = auVar68._2_14_;
            vNH[0]._6_2_ = ptr_00[(long)end_ref + 7];
            auVar39 = stack0xfffffffffffff7d8;
            stack0xfffffffffffff7a8 = vJ._10_14_;
            vF[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar68 = stack0xfffffffffffff7a8;
            vWH[1] = (longlong)((unkuint10)Var25 >> 0x10);
            vNH[0] = auVar39._8_8_;
            auVar38._8_8_ = vNH[0];
            auVar38._0_8_ = vWH[1];
            auVar37._8_8_ = uVar30;
            auVar37._0_8_ = uVar29;
            auVar67 = psubsw(auVar38,auVar37);
            vJ[1] = auVar51._2_8_;
            vF[0] = auVar68._8_8_;
            auVar36._8_8_ = vF[0];
            auVar36._0_8_ = vJ[1];
            auVar35._8_8_ = uVar32;
            auVar35._0_8_ = uVar31;
            auVar51 = psubsw(auVar36,auVar35);
            local_338 = auVar67._0_2_;
            sStack_336 = auVar67._2_2_;
            sStack_334 = auVar67._4_2_;
            sStack_332 = auVar67._6_2_;
            sStack_330 = auVar67._8_2_;
            sStack_32e = auVar67._10_2_;
            sStack_32c = auVar67._12_2_;
            sStack_32a = auVar67._14_2_;
            local_348 = auVar51._0_2_;
            sStack_346 = auVar51._2_2_;
            sStack_344 = auVar51._4_2_;
            sStack_342 = auVar51._6_2_;
            sStack_340 = auVar51._8_2_;
            sStack_33e = auVar51._10_2_;
            sStack_33c = auVar51._12_2_;
            sStack_33a = auVar51._14_2_;
            uVar48 = (ushort)(local_338 < local_348) * local_348 |
                     (ushort)(local_338 >= local_348) * local_338;
            uVar52 = (ushort)(sStack_336 < sStack_346) * sStack_346 |
                     (ushort)(sStack_336 >= sStack_346) * sStack_336;
            uVar54 = (ushort)(sStack_334 < sStack_344) * sStack_344 |
                     (ushort)(sStack_334 >= sStack_344) * sStack_334;
            uVar56 = (ushort)(sStack_332 < sStack_342) * sStack_342 |
                     (ushort)(sStack_332 >= sStack_342) * sStack_332;
            uVar58 = (ushort)(sStack_330 < sStack_340) * sStack_340 |
                     (ushort)(sStack_330 >= sStack_340) * sStack_330;
            uVar61 = (ushort)(sStack_32e < sStack_33e) * sStack_33e |
                     (ushort)(sStack_32e >= sStack_33e) * sStack_32e;
            uVar63 = (ushort)(sStack_32c < sStack_33c) * sStack_33c |
                     (ushort)(sStack_32c >= sStack_33c) * sStack_32c;
            uVar65 = (ushort)(sStack_32a < sStack_33a) * sStack_33a |
                     (ushort)(sStack_32a >= sStack_33a) * sStack_32a;
            auVar34._2_2_ = vE[1]._2_2_;
            auVar34._0_2_ = (short)vE[1];
            auVar34._4_2_ = vE[1]._4_2_;
            auVar34._6_2_ = vE[1]._6_2_;
            auVar34._10_2_ = vWH[0]._2_2_;
            auVar34._8_2_ = (short)vWH[0];
            auVar34._12_2_ = vWH[0]._4_2_;
            auVar34._14_2_ = vWH[0]._6_2_;
            auVar33._8_8_ = uVar30;
            auVar33._0_8_ = uVar29;
            auVar68 = psubsw(auVar34,auVar33);
            auVar67._8_8_ = vE[0];
            auVar67._0_8_ = vF[1];
            auVar51._8_8_ = uVar32;
            auVar51._0_8_ = uVar31;
            auVar51 = psubsw(auVar67,auVar51);
            local_358 = auVar68._0_2_;
            sStack_356 = auVar68._2_2_;
            sStack_354 = auVar68._4_2_;
            sStack_352 = auVar68._6_2_;
            sStack_350 = auVar68._8_2_;
            sStack_34e = auVar68._10_2_;
            sStack_34c = auVar68._12_2_;
            sStack_34a = auVar68._14_2_;
            local_368 = auVar51._0_2_;
            sStack_366 = auVar51._2_2_;
            sStack_364 = auVar51._4_2_;
            sStack_362 = auVar51._6_2_;
            sStack_360 = auVar51._8_2_;
            sStack_35e = auVar51._10_2_;
            sStack_35c = auVar51._12_2_;
            sStack_35a = auVar51._14_2_;
            uVar49 = (ushort)(local_358 < local_368) * local_368 |
                     (ushort)(local_358 >= local_368) * local_358;
            uVar53 = (ushort)(sStack_356 < sStack_366) * sStack_366 |
                     (ushort)(sStack_356 >= sStack_366) * sStack_356;
            uVar55 = (ushort)(sStack_354 < sStack_364) * sStack_364 |
                     (ushort)(sStack_354 >= sStack_364) * sStack_354;
            uVar57 = (ushort)(sStack_352 < sStack_362) * sStack_362 |
                     (ushort)(sStack_352 >= sStack_362) * sStack_352;
            uVar59 = (ushort)(sStack_350 < sStack_360) * sStack_360 |
                     (ushort)(sStack_350 >= sStack_360) * sStack_350;
            uVar62 = (ushort)(sStack_34e < sStack_35e) * sStack_35e |
                     (ushort)(sStack_34e >= sStack_35e) * sStack_34e;
            uVar64 = (ushort)(sStack_34c < sStack_35c) * sStack_35c |
                     (ushort)(sStack_34c >= sStack_35c) * sStack_34c;
            uVar66 = (ushort)(sStack_34a < sStack_35a) * sStack_35a |
                     (ushort)(sStack_34a >= sStack_35a) * sStack_34a;
            uVar1 = (undefined2)piVar16[(long)(iVar8 * local_9ac) + (long)piVar45[end_ref + -1]];
            mask[1] = CONCAT62((int6)((ulong)mask[1] >> 0x10),uVar1);
            uVar2 = (undefined2)piVar17[(long)(iVar9 * local_9c4) + (long)piVar45[end_ref + -2]];
            mask[0] = CONCAT62((int6)(uVar47 >> 0x10),uVar2);
            uVar3 = (undefined2)piVar18[(long)(iVar10 * local_9dc) + (long)piVar45[end_ref + -3]];
            a[0] = CONCAT62((int6)((ulong)array >> 0x10),uVar3);
            uVar4 = (undefined2)piVar19[(long)(iVar11 * local_9f4) + (long)piVar45[end_ref + -4]];
            a[1] = CONCAT62((int6)(alVar69[0] >> 0x10),uVar4);
            uVar5 = (undefined2)piVar20[(long)(iVar12 * local_a0c) + (long)piVar45[end_ref + -5]];
            alVar70[0]._2_6_ = (undefined6)(uVar46 >> 0x10);
            alVar70[0]._0_2_ = uVar5;
            uVar6 = (undefined2)piVar21[(long)(iVar13 * local_a24) + (long)piVar45[end_ref + -6]];
            alVar70[1] = CONCAT62(piVar45[end_ref + -6] >> 0xf,uVar6);
            auVar41._2_2_ = uVar6;
            auVar41._0_2_ =
                 (short)piVar22[(long)(int)(iVar14 * local_a3c) + (long)piVar45[end_ref + -7]];
            auVar41._4_2_ = uVar5;
            auVar41._6_2_ = uVar4;
            auVar41._10_2_ = uVar2;
            auVar41._8_2_ = uVar3;
            auVar41._12_2_ = uVar1;
            auVar41._14_2_ = (short)piVar15[(long)(iVar7 * local_994) + (long)piVar45[end_ref]];
            auVar51 = paddsw(auVar40,auVar41);
            local_378 = auVar51._0_2_;
            sStack_376 = auVar51._2_2_;
            sStack_374 = auVar51._4_2_;
            sStack_372 = auVar51._6_2_;
            sStack_370 = auVar51._8_2_;
            sStack_36e = auVar51._10_2_;
            sStack_36c = auVar51._12_2_;
            sStack_36a = auVar51._14_2_;
            uVar49 = (local_378 < (short)uVar49) * uVar49 |
                     (ushort)(local_378 >= (short)uVar49) * local_378;
            uVar53 = (sStack_376 < (short)uVar53) * uVar53 |
                     (ushort)(sStack_376 >= (short)uVar53) * sStack_376;
            uVar55 = (sStack_374 < (short)uVar55) * uVar55 |
                     (ushort)(sStack_374 >= (short)uVar55) * sStack_374;
            uVar57 = (sStack_372 < (short)uVar57) * uVar57 |
                     (ushort)(sStack_372 >= (short)uVar57) * sStack_372;
            uVar59 = (sStack_370 < (short)uVar59) * uVar59 |
                     (ushort)(sStack_370 >= (short)uVar59) * sStack_370;
            uVar62 = (sStack_36e < (short)uVar62) * uVar62 |
                     (ushort)(sStack_36e >= (short)uVar62) * sStack_36e;
            uVar64 = (sStack_36c < (short)uVar64) * uVar64 |
                     (ushort)(sStack_36c >= (short)uVar64) * sStack_36c;
            uVar66 = (sStack_36a < (short)uVar66) * uVar66 |
                     (ushort)(sStack_36a >= (short)uVar66) * sStack_36a;
            uVar48 = ((short)uVar49 < (short)uVar48) * uVar48 |
                     ((short)uVar49 >= (short)uVar48) * uVar49;
            uVar49 = ((short)uVar53 < (short)uVar52) * uVar52 |
                     ((short)uVar53 >= (short)uVar52) * uVar53;
            uVar52 = ((short)uVar55 < (short)uVar54) * uVar54 |
                     ((short)uVar55 >= (short)uVar54) * uVar55;
            uVar53 = ((short)uVar57 < (short)uVar56) * uVar56 |
                     ((short)uVar57 >= (short)uVar56) * uVar57;
            uVar54 = ((short)uVar59 < (short)uVar58) * uVar58 |
                     ((short)uVar59 >= (short)uVar58) * uVar59;
            uVar55 = ((short)uVar62 < (short)uVar61) * uVar61 |
                     ((short)uVar62 >= (short)uVar61) * uVar62;
            uVar56 = ((short)uVar64 < (short)uVar63) * uVar63 |
                     ((short)uVar64 >= (short)uVar63) * uVar64;
            uVar57 = ((short)uVar66 < (short)uVar65) * uVar65 |
                     ((short)uVar66 >= (short)uVar65) * uVar66;
            local_218 = (short)matrow0;
            sStack_216 = matrow0._2_2_;
            sStack_214 = matrow0._4_2_;
            sStack_212 = matrow0._6_2_;
            sStack_210 = matrow0._8_2_;
            sStack_20e = matrow0._10_2_;
            sStack_20c = matrow0._12_2_;
            sStack_20a = matrow0._14_2_;
            uVar23 = CONCAT22(-(ushort)(sStack_216 == -1),-(ushort)(local_218 == -1));
            uVar24 = CONCAT22(-(ushort)(sStack_20e == -1),-(ushort)(sStack_210 == -1));
            uVar50 = CONCAT22((-1 < (short)uVar49) * uVar49,(-1 < (short)uVar48) * uVar48);
            uVar60 = CONCAT22((-1 < (short)uVar55) * uVar55,(-1 < (short)uVar54) * uVar54);
            uStack_1f4 = (uint)(CONCAT26(-(ushort)(sStack_212 == -1),
                                         CONCAT24(-(ushort)(sStack_214 == -1),uVar23)) >> 0x20);
            uStack_1ec = (uint)(CONCAT26(-(ushort)(sStack_20a == -1),
                                         CONCAT24(-(ushort)(sStack_20c == -1),uVar24)) >> 0x20);
            uStack_204 = (uint)(CONCAT26((-1 < (short)uVar53) * uVar53,
                                         CONCAT24((-1 < (short)uVar52) * uVar52,uVar50)) >> 0x20);
            uStack_1fc = (uint)(CONCAT26((-1 < (short)uVar57) * uVar57,
                                         CONCAT24((-1 < (short)uVar56) * uVar56,uVar60)) >> 0x20);
            uVar50 = (uVar23 ^ 0xffffffff) & uVar50;
            uStack_204 = (uStack_1f4 ^ 0xffffffff) & uStack_204;
            uVar60 = (uVar24 ^ 0xffffffff) & uVar60;
            uStack_1fc = (uStack_1ec ^ 0xffffffff) & uStack_1fc;
            vE[1]._0_2_ = (short)uVar50;
            vE[1]._2_2_ = (short)(uVar50 >> 0x10);
            vE[1]._4_2_ = (short)uStack_204;
            vE[1]._6_2_ = (short)(uStack_204 >> 0x10);
            vWH[0]._0_2_ = (short)uVar60;
            vWH[0]._2_2_ = (short)(uVar60 >> 0x10);
            vWH[0]._4_2_ = (short)uStack_1fc;
            vWH[0]._6_2_ = (short)(uStack_1fc >> 0x10);
            piVar71 = piVar45;
            alVar69 = _mm_blendv_epi8_rpl(a,alVar70,mask);
            s2Len_00 = (int32_t)piVar71;
            b[0] = alVar69[1];
            vF[0] = extraout_XMM0_Qb;
            vJ[1] = extraout_XMM0_Qa;
            auVar51 = stack0xfffffffffffff7a8;
            b[1] = alVar70[1];
            mask_00[1] = mask[1];
            mask_00[0] = mask[0];
            a_00[1] = a[1];
            a_00[0] = a[0];
            _mm_blendv_epi8_rpl(a_00,b,mask_00);
            if (7 < end_ref) {
              local_1d8 = (short)vSaturationCheckMax[1];
              sStack_1d6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_1d4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_1d2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_1d0 = (short)vSaturationCheckMin[0];
              sStack_1ce = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_1cc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_1ca = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(vE[1]._6_2_ < sStack_1d2) * vE[1]._6_2_ |
                            (ushort)(vE[1]._6_2_ >= sStack_1d2) * sStack_1d2,
                            CONCAT24((ushort)(vE[1]._4_2_ < sStack_1d4) * vE[1]._4_2_ |
                                     (ushort)(vE[1]._4_2_ >= sStack_1d4) * sStack_1d4,
                                     CONCAT22((ushort)(vE[1]._2_2_ < sStack_1d6) * vE[1]._2_2_ |
                                              (ushort)(vE[1]._2_2_ >= sStack_1d6) * sStack_1d6,
                                              (ushort)((short)vE[1] < local_1d8) * (short)vE[1] |
                                              (ushort)((short)vE[1] >= local_1d8) * local_1d8)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(vWH[0]._6_2_ < sStack_1ca) * vWH[0]._6_2_ |
                            (ushort)(vWH[0]._6_2_ >= sStack_1ca) * sStack_1ca,
                            CONCAT24((ushort)(vWH[0]._4_2_ < sStack_1cc) * vWH[0]._4_2_ |
                                     (ushort)(vWH[0]._4_2_ >= sStack_1cc) * sStack_1cc,
                                     CONCAT22((ushort)(vWH[0]._2_2_ < sStack_1ce) * vWH[0]._2_2_ |
                                              (ushort)(vWH[0]._2_2_ >= sStack_1ce) * sStack_1ce,
                                              (ushort)((short)vWH[0] < sStack_1d0) * (short)vWH[0] |
                                              (ushort)((short)vWH[0] >= sStack_1d0) * sStack_1d0)));
              local_3d8 = (short)vNegInf[1];
              sStack_3d6 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_3d4 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_3d2 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_3d0 = (short)vSaturationCheckMax[0];
              sStack_3ce = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_3cc = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_3ca = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              vNegInf[1] = CONCAT26((ushort)(sStack_3d2 < vE[1]._6_2_) * vE[1]._6_2_ |
                                    (ushort)(sStack_3d2 >= vE[1]._6_2_) * sStack_3d2,
                                    CONCAT24((ushort)(sStack_3d4 < vE[1]._4_2_) * vE[1]._4_2_ |
                                             (ushort)(sStack_3d4 >= vE[1]._4_2_) * sStack_3d4,
                                             CONCAT22((ushort)(sStack_3d6 < vE[1]._2_2_) *
                                                      vE[1]._2_2_ |
                                                      (ushort)(sStack_3d6 >= vE[1]._2_2_) *
                                                      sStack_3d6,
                                                      (ushort)(local_3d8 < (short)vE[1]) *
                                                      (short)vE[1] |
                                                      (ushort)(local_3d8 >= (short)vE[1]) *
                                                      local_3d8)));
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)(sStack_3ca < vWH[0]._6_2_) * vWH[0]._6_2_ |
                            (ushort)(sStack_3ca >= vWH[0]._6_2_) * sStack_3ca,
                            CONCAT24((ushort)(sStack_3cc < vWH[0]._4_2_) * vWH[0]._4_2_ |
                                     (ushort)(sStack_3cc >= vWH[0]._4_2_) * sStack_3cc,
                                     CONCAT22((ushort)(sStack_3ce < vWH[0]._2_2_) * vWH[0]._2_2_ |
                                              (ushort)(sStack_3ce >= vWH[0]._2_2_) * sStack_3ce,
                                              (ushort)(sStack_3d0 < (short)vWH[0]) * (short)vWH[0] |
                                              (ushort)(sStack_3d0 >= (short)vWH[0]) * sStack_3d0)));
            }
            array = ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row;
            alVar69[0] = (size_t)(uint)end_query;
            uVar47 = (ulong)(uint)s2Len;
            alVar69[1]._0_4_ = local_968;
            alVar69[1]._4_4_ = 0;
            arr_store_si128(array,alVar69,end_ref,s2Len,(int32_t)mask[1],s2Len_00);
            b_00[0]._2_6_ = (undefined6)((ulong)extraout_RDX >> 0x10);
            ptr_00[(long)(end_ref + -7) + 7] = (short)vE[1];
            vJ[1]._0_2_ = (int16_t)extraout_XMM0_Qa;
            b_00[0]._0_2_ = (int16_t)vJ[1];
            b_00[1] = (long)(end_ref + -7);
            ptr_01[b_00[1] + 7] = (int16_t)vJ[1];
            mask_01[1] = mask[1];
            mask_01[0] = uVar47;
            a_01[1] = alVar69[0];
            a_01[0] = (longlong)array;
            alVar70 = _mm_blendv_epi8_rpl(a_01,b_00,mask_01);
            b_01[0] = alVar70[1];
            b_01[1] = b_00[1];
            mask_02[1] = mask[1];
            mask_02[0] = uVar47;
            a_02[1] = alVar69[0];
            a_02[0] = (longlong)array;
            vEndI[1] = extraout_XMM0_Qa_01;
            alVar70 = _mm_blendv_epi8_rpl(a_02,b_01,mask_02);
            b_02[0] = alVar70[1];
            b_02[1] = b_00[1];
            mask_03[1] = mask[1];
            mask_03[0] = uVar47;
            a_03[1] = alVar69[0];
            a_03[0] = (longlong)array;
            alVar70 = _mm_blendv_epi8_rpl(a_03,b_02,mask_03);
            b_03[0] = alVar70[1];
            b_03[1] = b_00[1];
            mask_04[1] = mask[1];
            mask_04[0] = uVar47;
            a_04[1] = alVar69[0];
            a_04[0] = (longlong)array;
            alVar70 = _mm_blendv_epi8_rpl(a_04,b_03,mask_04);
            b_04[0] = alVar70[1];
            b_04[1] = b_00[1];
            mask_05[1] = mask[1];
            mask_05[0] = uVar47;
            a_05[1] = alVar69[0];
            a_05[0] = (longlong)array;
            vEndJ[1] = extraout_XMM0_Qa_02;
            vEndI[0] = extraout_XMM0_Qb_01;
            alVar70 = _mm_blendv_epi8_rpl(a_05,b_04,mask_05);
            uVar46 = alVar70[1];
            auVar40._8_8_ = 0x1000100010001;
            auVar40._0_8_ = 0x1000100010001;
            _matrow0 = paddsw(_matrow0,auVar40);
            unique0x1000313d = auVar51;
            vF[1] = extraout_XMM0_Qa_00;
            vE[0] = extraout_XMM0_Qb_00;
            unique0x1000318b = auVar39;
            vILimit[1] = extraout_XMM0_Qa_03;
            vEndJ[0] = extraout_XMM0_Qb_02;
          }
          auVar39._8_8_ = 0x8000800080008;
          auVar39._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xfffffffffffff848,auVar39);
        }
        i_1 = (int16_t *)(vEndI + 1);
        j_1 = (int16_t *)(vEndJ + 1);
        plStack_960 = vILimit + 1;
        local_6de = sVar43;
        for (local_964 = 0; local_964 < 8; local_964 = local_964 + 1) {
          if (local_6de < *i_1) {
            local_6de = *i_1;
            _POS_LIMIT = (int)*j_1;
            iStack_6d8 = (int)(short)*plStack_960;
          }
          else if (*i_1 == local_6de) {
            if ((short)*plStack_960 < iStack_6d8) {
              _POS_LIMIT = (int)*j_1;
              iStack_6d8 = (int)(short)*plStack_960;
            }
            else if (((short)*plStack_960 == iStack_6d8) && (*j_1 < _POS_LIMIT)) {
              _POS_LIMIT = (int)*j_1;
              iStack_6d8 = (int)(short)*plStack_960;
            }
          }
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_960 = (longlong *)((long)plStack_960 + 2);
        }
        local_c8 = (short)vSaturationCheckMax[1];
        sStack_c6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_c4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_c2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_c0 = (short)vSaturationCheckMin[0];
        sStack_be = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_bc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_ba = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_98 = (short)vNegInf[1];
        sStack_96 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_94 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_92 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_90 = (short)vSaturationCheckMax[0];
        sStack_8e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_8c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_8a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar47 = CONCAT26(-(ushort)(sStack_ba < sVar43),
                          CONCAT24(-(ushort)(sStack_bc < sVar43),
                                   CONCAT22(-(ushort)(sStack_be < sVar43),
                                            -(ushort)(sStack_c0 < sVar43)))) |
                 CONCAT26(-(ushort)(sVar44 < sStack_8a),
                          CONCAT24(-(ushort)(sVar44 < sStack_8c),
                                   CONCAT22(-(ushort)(sVar44 < sStack_8e),
                                            -(ushort)(sVar44 < sStack_90))));
        auVar42._8_8_ = uVar47;
        auVar42._0_8_ =
             CONCAT26(-(ushort)(sStack_c2 < sVar43),
                      CONCAT24(-(ushort)(sStack_c4 < sVar43),
                               CONCAT22(-(ushort)(sStack_c6 < sVar43),-(ushort)(local_c8 < sVar43)))
                     ) |
             CONCAT26(-(ushort)(sVar44 < sStack_92),
                      CONCAT24(-(ushort)(sVar44 < sStack_94),
                               CONCAT22(-(ushort)(sVar44 < sStack_96),-(ushort)(sVar44 < local_98)))
                     );
        if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar47 >> 7 & 1) != 0) || (uVar47 >> 0xf & 1) != 0) || (uVar47 >> 0x17 & 1) != 0)
               || (uVar47 >> 0x1f & 1) != 0) || (uVar47 >> 0x27 & 1) != 0) ||
             (uVar47 >> 0x2f & 1) != 0) || (uVar47 >> 0x37 & 1) != 0) || (long)uVar47 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_6de = 0;
          _POS_LIMIT = 0;
          iStack_6d8 = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)local_6de;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = iStack_6d8;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}